

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O0

void __thiscall QGraphicsAnchorLayout::~QGraphicsAnchorLayout(QGraphicsAnchorLayout *this)

{
  bool bVar1;
  const_reference ppQVar2;
  long *in_RDI;
  Orientation in_stack_00000014;
  QGraphicsLayoutItem *item;
  QGraphicsAnchorLayoutPrivate *in_stack_00000020;
  int i;
  QGraphicsAnchorLayoutPrivate *d;
  qsizetype in_stack_ffffffffffffffc8;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffffd0;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffffe0;
  QGraphicsAnchorLayoutPrivate *pQVar3;
  int local_14;
  
  *in_RDI = (long)&PTR__QGraphicsAnchorLayout_00d31e80;
  d_func((QGraphicsAnchorLayout *)0x935d2a);
  local_14 = (**(code **)(*in_RDI + 0x48))();
  while (local_14 = local_14 + -1, -1 < local_14) {
    ppQVar2 = QList<QGraphicsLayoutItem_*>::at
                        ((QList<QGraphicsLayoutItem_*> *)in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffe0 = (QGraphicsAnchorLayoutPrivate *)*ppQVar2;
    (**(code **)(*in_RDI + 0x58))(in_RDI,local_14);
    if (((in_stack_ffffffffffffffe0 != (QGraphicsAnchorLayoutPrivate *)0x0) &&
        (bVar1 = QGraphicsLayoutItem::ownedByLayout((QGraphicsLayoutItem *)0x935d87), bVar1)) &&
       (in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffe0,
       in_stack_ffffffffffffffe0 != (QGraphicsAnchorLayoutPrivate *)0x0)) {
      pQVar3 = in_stack_ffffffffffffffe0;
      (*(in_stack_ffffffffffffffe0->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
        _vptr_QGraphicsLayoutItemPrivate[1])();
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffe0;
      in_stack_ffffffffffffffe0 = pQVar3;
    }
  }
  QGraphicsAnchorLayoutPrivate::removeCenterConstraints(in_stack_00000020,item,in_stack_00000014);
  QGraphicsAnchorLayoutPrivate::removeCenterConstraints(in_stack_00000020,item,in_stack_00000014);
  QGraphicsAnchorLayoutPrivate::deleteLayoutEdges(in_stack_ffffffffffffffe0);
  QGraphicsLayout::~QGraphicsLayout((QGraphicsLayout *)0x935df7);
  return;
}

Assistant:

QGraphicsAnchorLayout::~QGraphicsAnchorLayout()
{
    Q_D(QGraphicsAnchorLayout);

    for (int i = count() - 1; i >= 0; --i) {
        QGraphicsLayoutItem *item = d->items.at(i);
        removeAt(i);
        if (item) {
            if (item->ownedByLayout())
                delete item;
        }
    }

    d->removeCenterConstraints(this, Qt::Horizontal);
    d->removeCenterConstraints(this, Qt::Vertical);
    d->deleteLayoutEdges();

    Q_ASSERT(d->itemCenterConstraints[Qt::Horizontal].isEmpty());
    Q_ASSERT(d->itemCenterConstraints[Qt::Vertical].isEmpty());
    Q_ASSERT(d->items.isEmpty());
    Q_ASSERT(d->m_vertexList.isEmpty());
}